

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O0

int Gia_ManGetTwo(Gia_Man_t *p,int iFrame,Gia_Obj_t *pObj)

{
  Vec_Int_t *vData;
  int iObj;
  int iVar1;
  Gia_Obj_t *pObj_local;
  int iFrame_local;
  Gia_Man_t *p_local;
  
  vData = p->vTruths;
  iVar1 = p->nTtWords;
  iObj = Gia_ObjId(p,pObj);
  iVar1 = Abc_InfoGet2Bits(vData,iVar1,iFrame,iObj);
  return iVar1;
}

Assistant:

static inline int  Gia_ManGetTwo( Gia_Man_t * p, int iFrame, Gia_Obj_t * pObj )              { return Abc_InfoGet2Bits( p->vTruths, p->nTtWords, iFrame, Gia_ObjId(p, pObj) ); }